

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

void xmlFreeTextWriterStackEntry(xmlLinkPtr lk)

{
  long *plVar1;
  xmlTextWriterStackEntry *p;
  xmlLinkPtr lk_local;
  
  plVar1 = (long *)xmlLinkGetData(lk);
  if (plVar1 != (long *)0x0) {
    if (*plVar1 != 0) {
      (*xmlFree)((void *)*plVar1);
    }
    (*xmlFree)(plVar1);
  }
  return;
}

Assistant:

static void
xmlFreeTextWriterStackEntry(xmlLinkPtr lk)
{
    xmlTextWriterStackEntry *p;

    p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
    if (p == 0)
        return;

    if (p->name != 0)
        xmlFree(p->name);
    xmlFree(p);
}